

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O1

void __thiscall stackjit::ClassLoader::loadClasses(ClassLoader *this,ImageContainer *imageContainer)

{
  pointer ppAVar1;
  bool bVar2;
  vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_> *pvVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Class>_>_>
  *puVar4;
  _Hash_node_base *p_Var5;
  pointer ppAVar6;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> classes;
  ImageContainer *local_68;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *pvStack_60;
  code *local_58;
  code *pcStack_50;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> local_48;
  
  pvStack_60 = &local_48;
  local_48.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcStack_50 = std::
               _Function_handler<void_(const_stackjit::Loader::Class_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/loader/classloader.cpp:102:32)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_stackjit::Loader::Class_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/loader/classloader.cpp:102:32)>
             ::_M_manager;
  local_68 = imageContainer;
  pvVar3 = ImageContainer::images(imageContainer);
  ppAVar6 = (pvVar3->
            super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (pvVar3->
            super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppAVar6 == ppAVar1) {
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      loadClasses(this,&local_48);
      std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::~vector
                (&local_48);
      return;
    }
    bVar2 = AssemblyImage::hasLoadedDefinitions(*ppAVar6);
    if (!bVar2) {
      puVar4 = AssemblyImage::classes_abi_cxx11_(*ppAVar6);
      for (p_Var5 = (puVar4->_M_h)._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
          p_Var5 = p_Var5->_M_nxt) {
        if (local_58 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*pcStack_50)(&local_68,p_Var5 + 5);
      }
    }
    ppAVar6 = ppAVar6 + 1;
  } while( true );
}

Assistant:

void ClassLoader::loadClasses(ImageContainer& imageContainer) {
		std::vector<Loader::Class> classes;
		forEachClass(imageContainer, [&](const stackjit::Loader::Class& classDef) {
			imageContainer.loadClassBody(classDef.name());
			classes.push_back(classDef);
		});

		loadClasses(classes);
	}